

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ListBuilder * __thiscall
capnp::_::PointerBuilder::getStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize elementSize,
          word *defaultValue)

{
  ushort uVar1;
  BuilderArena *pBVar2;
  ushort uVar3;
  int iVar4;
  SegmentBuilder *this_00;
  unsigned_long uVar5;
  SegmentBuilder *pSVar6;
  ulong uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  word *pwVar10;
  word *pwVar11;
  StructSize SVar12;
  WirePointer *pWVar13;
  WirePointer *pWVar14;
  uint uVar15;
  int iVar16;
  ushort uVar17;
  ListElementCount LVar18;
  StructSize SVar19;
  byte bVar20;
  uint uVar21;
  ListElementCount LVar22;
  WirePointer *dst;
  AllocateResult AVar23;
  AllocateResult AVar24;
  AllocateResult AVar25;
  Fault f;
  Iterator __end5;
  AllocateResult local_c8;
  Fault local_b8;
  WirePointer *local_b0;
  WirePointer *local_a8;
  ulong local_a0;
  WirePointer *local_98;
  CapTableBuilder *local_90;
  WirePointer *local_88;
  word *local_80;
  ulong local_78;
  ListBuilder *local_70;
  uint local_64;
  ulong local_60;
  word *local_58;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_c8.words = (word *)this->pointer;
  local_c8.segment = this->segment;
  local_90 = this->capTable;
  uVar21 = (((WirePointer *)local_c8.words)->offsetAndKind).value;
  uVar15 = (uint)elementSize >> 0x10;
  uVar7 = (ulong)uVar15;
  SVar12 = elementSize;
  if ((((WirePointer *)local_c8.words)->field_1).upper32Bits == 0 && uVar21 == 0) goto LAB_00235cea;
  local_a8 = (WirePointer *)local_c8.words + (long)((int)uVar21 >> 2) + 1;
  do {
    pwVar11 = local_c8.words;
    this_00 = local_c8.segment;
    pWVar14 = (WirePointer *)local_c8.words;
    if ((uVar21 & 3) == 2) {
      local_98 = (WirePointer *)CONCAT44(local_98._4_4_,SVar12);
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)((local_c8.segment)->super_SegmentReader).arena,
                           (SegmentId)
                           ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_c8.words + 4))
                           ->structRef);
      uVar21 = ((WireValue<uint32_t> *)&pwVar11->content)->value;
      pwVar11 = (this_00->super_SegmentReader).ptr.ptr;
      uVar9 = (ulong)(uVar21 & 0xfffffff8);
      pWVar13 = (WirePointer *)((long)&pwVar11->content + uVar9);
      pWVar14 = (WirePointer *)((long)&pwVar11[1].content + uVar9);
      if ((uVar21 & 4) == 0) {
        local_a8 = pWVar14 + ((int)(pWVar13->offsetAndKind).value >> 2);
        pWVar14 = pWVar13;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)(pWVar13->field_1).structRef);
        local_a8 = (WirePointer *)
                   ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                   (ulong)((pWVar13->offsetAndKind).value & 0xfffffff8));
      }
      SVar12 = local_98._0_4_;
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    pwVar11 = local_c8.words;
    pSVar6 = local_c8.segment;
    if (((pWVar14->offsetAndKind).value & 3) == 1) {
      uVar21 = (pWVar14->field_1).upper32Bits;
      bVar20 = (byte)uVar21 & 7;
      uVar17 = elementSize.pointers;
      if (bVar20 == 7) {
        uVar21 = (uint)*(uint64_t *)&(local_a8->offsetAndKind).value;
        if ((uVar21 & 3) != 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
                    (&local_b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x5af,FAILED,"oldTag->kind() == WirePointer::STRUCT",
                     "\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\"",
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          goto LAB_00236638;
        }
        local_88 = local_a8 + 1;
        uVar1 = *(ushort *)&local_a8->field_1;
        local_80 = (word *)(ulong)uVar1;
        uVar3 = *(ushort *)((long)&local_a8->field_1 + 2);
        local_38 = (ulong)uVar3;
        local_a0 = (ulong)((uint)uVar3 + (uint)uVar1);
        uVar21 = uVar21 >> 2 & 0x1fffffff;
        SVar19.pointers = 0;
        SVar19.data = uVar1;
        if (uVar3 < uVar17 || uVar1 < SVar12.data) {
          if (uVar1 <= SVar12.data) {
            SVar19 = SVar12;
          }
          if (uVar17 < uVar3) {
            uVar15 = (uint)uVar3;
          }
          uVar3 = (ushort)uVar15;
          local_64 = (uint)SVar19 & 0xffff;
          local_78 = (ulong)(uVar15 + local_64);
          uVar5 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_1_>
                            (local_78 * uVar21,(anon_class_1_0_00000001 *)&local_b8);
          pwVar11 = local_c8.words;
          if (((((WireValue<uint32_t> *)&(local_c8.words)->content)->value & 3) == 2) &&
             (pSVar6 = BuilderArena::getSegment
                                 ((BuilderArena *)((local_c8.segment)->super_SegmentReader).arena,
                                  (SegmentId)
                                  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                  ((long)local_c8.words + 4))->structRef), pSVar6->readOnly == false
             )) {
            uVar15 = ((WireValue<uint32_t> *)&pwVar11->content)->value;
            puVar8 = (undefined8 *)
                     ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                     (ulong)(uVar15 & 0xfffffff8));
            if ((uVar15 & 4) == 0) {
              *puVar8 = 0;
            }
            else {
              *puVar8 = 0;
              puVar8[1] = 0;
            }
          }
          *pwVar11 = 0;
          if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_c8.words + 4))->upper32Bits
              != 0 || ((WireValue<uint32_t> *)&(local_c8.words)->content)->value != 0) {
            WireHelpers::zeroObject(local_c8.segment,local_90,(WirePointer *)local_c8.words);
          }
          AVar24.words = local_c8.words;
          AVar24.segment = local_c8.segment;
          pwVar11 = (local_c8.segment)->pos;
          uVar7 = uVar5 + 1 & 0xffffffff;
          if (((long)((long)((local_c8.segment)->super_SegmentReader).ptr.ptr +
                     (((local_c8.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar11)) >> 3
               < (long)uVar7) || ((local_c8.segment)->pos = pwVar11 + uVar7, pwVar11 == (word *)0x0)
             ) {
            pBVar2 = (BuilderArena *)((local_c8.segment)->super_SegmentReader).arena;
            local_70 = __return_storage_ptr__;
            uVar15 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                               ((int)uVar5 + 2,(anon_class_1_0_00000001 *)&local_b8);
            AVar24 = BuilderArena::allocate(pBVar2,uVar15);
            ((WireValue<uint32_t> *)&(local_c8.words)->content)->value =
                 (int)AVar24.words - *(int *)&((AVar24.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)local_c8.words + 4) = ((AVar24.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar24.words)->content = 1;
            pwVar11 = AVar24.words + 1;
          }
          else {
            ((WireValue<uint32_t> *)&(local_c8.words)->content)->value =
                 ((uint)((ulong)((long)pwVar11 - (long)local_c8.words) >> 1) & 0xfffffffc) - 3;
            local_70 = __return_storage_ptr__;
          }
          local_c8.words = AVar24.words;
          *(int *)((long)&(local_c8.words)->content + 4) = (int)uVar5 * 8 + 7;
          *(uint *)&pwVar11->content = uVar21 * 4;
          *(StructDataWordCount *)((long)&pwVar11->content + 4) = SVar19.data;
          *(ushort *)((long)&pwVar11->content + 6) = uVar3;
          local_50 = (size_t)(uint)((int)local_80 << 3);
          local_60 = local_a0 & 0xffffffff;
          local_98 = (WirePointer *)(pwVar11 + ((ulong)(uint)SVar19 & 0xffff) + 1);
          pwVar11 = pwVar11 + 1;
          local_48 = (ulong)(uint)((int)local_78 * 8);
          local_b0 = (WirePointer *)((long)&local_a8[1].offsetAndKind.value + local_50);
          local_a0 = (ulong)(uint)((int)local_a0 << 3);
          LVar18 = 0;
          pWVar14 = local_88;
          local_58 = pwVar11;
          local_40 = (ulong)uVar21;
          while (LVar22 = (ListElementCount)local_40, local_c8 = AVar24, LVar18 != LVar22) {
            local_88 = (WirePointer *)CONCAT44(local_88._4_4_,LVar18);
            pWVar13 = local_b0;
            uVar7 = local_38;
            dst = local_98;
            if ((short)local_80 != 0) {
              memcpy(pwVar11,pWVar14,local_50);
              pWVar13 = local_b0;
              uVar7 = local_38;
              dst = local_98;
              AVar24 = local_c8;
            }
            while( true ) {
              local_c8.segment = AVar24.segment;
              if (uVar7 == 0) break;
              WireHelpers::transferPointer(local_c8.segment,dst,this_00,pWVar13);
              local_c8 = AVar24;
              pWVar13 = pWVar13 + 1;
              uVar7 = uVar7 - 1;
              dst = dst + 1;
              AVar24 = local_c8;
            }
            pwVar11 = pwVar11 + local_78;
            pWVar14 = pWVar14 + local_60;
            local_98 = (WirePointer *)((long)&(local_98->offsetAndKind).value + local_48);
            local_b0 = (WirePointer *)((long)&(local_b0->offsetAndKind).value + local_a0);
            LVar18 = (int)local_88 + 1;
          }
          uVar5 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_2_>
                            (local_60 * local_40,(anon_class_1_0_00000001 *)&local_b8);
          iVar4 = (int)uVar5 + 1;
          if (iVar4 != 0) {
            memset(local_a8,0,(ulong)(uint)(iVar4 * 8));
          }
          local_70->segment = local_c8.segment;
          local_70->capTable = local_90;
          local_70->ptr = (byte *)local_58;
          local_70->elementCount = LVar22;
          local_70->step = (int)local_78 << 6;
          local_70->structDataSize = local_64 << 6;
          __return_storage_ptr__ = local_70;
        }
        else {
          __return_storage_ptr__->segment = this_00;
          __return_storage_ptr__->capTable = local_90;
          __return_storage_ptr__->ptr = (byte *)local_88;
          __return_storage_ptr__->elementCount = uVar21;
          __return_storage_ptr__->step = ((uint)uVar3 + (uint)uVar1) * 0x40;
          __return_storage_ptr__->structDataSize = (uint)uVar1 << 6;
        }
        goto LAB_00236598;
      }
      uVar9 = (ulong)(uVar21 >> 3);
      iVar4 = (int)uVar7;
      if ((uVar21 & 7) == 0) {
        AVar23.words = local_c8.words;
        AVar23.segment = local_c8.segment;
        local_70 = __return_storage_ptr__;
        uVar21 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_1_>
                           (uVar21 >> 3,(anon_class_1_0_00000001 *)&local_b8);
        local_98 = (WirePointer *)CONCAT44(local_98._4_4_,SVar12);
        uVar15 = iVar4 + ((uint)SVar12 & 0xffff);
        local_b0 = (WirePointer *)CONCAT44(local_b0._4_4_,uVar21);
        uVar5 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::initStructListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::StructSize,capnp::_::BuilderArena*)::_lambda()_2_>
                          ((ulong)uVar15 * (ulong)uVar21,(anon_class_1_0_00000001 *)&local_b8);
        if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pwVar11 + 4))->upper32Bits != 0 ||
            ((WireValue<uint32_t> *)&pwVar11->content)->value != 0) {
          WireHelpers::zeroObject(pSVar6,local_90,(WirePointer *)pwVar11);
        }
        pwVar10 = pSVar6->pos;
        uVar7 = uVar5 + 1 & 0xffffffff;
        if (((long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                   ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar10)) >> 3 < (long)uVar7
            ) || (pSVar6->pos = pwVar10 + uVar7, pwVar10 == (word *)0x0)) {
          pBVar2 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
          uVar21 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                             ((int)uVar5 + 2,(anon_class_1_0_00000001 *)&local_b8);
          AVar23 = BuilderArena::allocate(pBVar2,uVar21);
          ((WireValue<uint32_t> *)&pwVar11->content)->value =
               (int)AVar23.words - *(int *)&((AVar23.segment)->super_SegmentReader).ptr.ptr &
               0xfffffff8U | 2;
          *(uint *)((long)pwVar11 + 4) = ((AVar23.segment)->super_SegmentReader).id.value;
          *(undefined4 *)&(AVar23.words)->content = 1;
          pwVar10 = AVar23.words + 1;
        }
        else {
          ((WireValue<uint32_t> *)&pwVar11->content)->value =
               ((uint)((ulong)((long)pwVar10 - (long)pwVar11) >> 1) & 0xfffffffc) - 3;
        }
        *(int *)((long)&(AVar23.words)->content + 4) = (int)uVar5 * 8 + 7;
        *(ListElementCount *)&pwVar10->content = (ListElementCount)local_b0 << 2;
        *(short *)((long)&pwVar10->content + 4) = (short)local_98;
        *(ushort *)((long)&pwVar10->content + 6) = uVar17;
        local_70->segment = AVar23.segment;
        local_70->capTable = local_90;
        local_70->ptr = (byte *)(pwVar10 + 1);
        local_70->elementCount = (ListElementCount)local_b0;
        local_70->step = uVar15 * 0x40;
        local_70->structDataSize = ((uint)SVar12 & 0xffff) << 6;
        local_70->structPointerCount = uVar17;
        goto LAB_0023659d;
      }
      local_b0 = (WirePointer *)((ulong)local_b0 & 0xffffffff00000000);
      local_88 = (WirePointer *)uVar9;
      if (bVar20 != 1) {
        local_80 = (word *)CONCAT71(local_80._1_7_,bVar20 == 6);
        if (bVar20 == 6) {
          uVar15 = iVar4 + (uint)(iVar4 == 0);
        }
        else {
          SVar12 = (StructSize)(((uint)SVar12 & 0xffff) + (uint)(((uint)SVar12 & 0xffff) == 0));
        }
        uVar3 = (ushort)uVar15;
        uVar21 = *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar20 * 4);
        local_98 = (WirePointer *)CONCAT44(local_98._4_4_,SVar12);
        local_78 = (ulong)((uint)SVar12 & 0xffff);
        local_a0 = (ulong)((uVar15 & 0xffff) + ((uint)SVar12 & 0xffff));
        local_70 = __return_storage_ptr__;
        uVar5 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_3_>
                          (local_a0 * uVar9,(anon_class_1_0_00000001 *)&local_b8);
        pwVar11 = local_c8.words;
        if (((((WireValue<uint32_t> *)&(local_c8.words)->content)->value & 3) == 2) &&
           (pSVar6 = BuilderArena::getSegment
                               ((BuilderArena *)((local_c8.segment)->super_SegmentReader).arena,
                                (SegmentId)
                                ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                ((long)local_c8.words + 4))->structRef), pSVar6->readOnly == false))
        {
          uVar15 = ((WireValue<uint32_t> *)&pwVar11->content)->value;
          puVar8 = (undefined8 *)
                   ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                   (ulong)(uVar15 & 0xfffffff8));
          if ((uVar15 & 4) == 0) {
            *puVar8 = 0;
          }
          else {
            *puVar8 = 0;
            puVar8[1] = 0;
          }
        }
        *pwVar11 = 0;
        iVar4 = CONCAT31((int3)((ulong)local_b0 >> 8),local_80._0_1_);
        local_b0._0_4_ = iVar4;
        if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_c8.words + 4))->upper32Bits
            != 0 || ((WireValue<uint32_t> *)&(local_c8.words)->content)->value != 0) {
          WireHelpers::zeroObject(local_c8.segment,local_90,(WirePointer *)local_c8.words);
        }
        AVar25.words = local_c8.words;
        AVar25.segment = local_c8.segment;
        local_b0._0_4_ = (ListElementCount)local_b0 << 6;
        pwVar11 = (local_c8.segment)->pos;
        uVar7 = uVar5 + 1 & 0xffffffff;
        if (((long)((long)((local_c8.segment)->super_SegmentReader).ptr.ptr +
                   (((local_c8.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar11)) >> 3 <
             (long)uVar7) || ((local_c8.segment)->pos = pwVar11 + uVar7, pwVar11 == (word *)0x0)) {
          pBVar2 = (BuilderArena *)((local_c8.segment)->super_SegmentReader).arena;
          uVar15 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::allocate(capnp::_::WirePointer*&,capnp::_::SegmentBuilder*&,capnp::_::CapTableBuilder*,unsigned_int,capnp::_::WirePointer::Kind,capnp::_::BuilderArena*)::_lambda()_1_>
                             ((int)uVar5 + 2,(anon_class_1_0_00000001 *)&local_b8);
          AVar25 = BuilderArena::allocate(pBVar2,uVar15);
          ((WireValue<uint32_t> *)&(local_c8.words)->content)->value =
               (int)AVar25.words - *(int *)&((AVar25.segment)->super_SegmentReader).ptr.ptr &
               0xfffffff8U | 2;
          *(uint *)((long)local_c8.words + 4) = ((AVar25.segment)->super_SegmentReader).id.value;
          *(undefined4 *)&(AVar25.words)->content = 1;
          pwVar11 = AVar25.words + 1;
        }
        else {
          ((WireValue<uint32_t> *)&(local_c8.words)->content)->value =
               ((uint)((ulong)((long)pwVar11 - (long)local_c8.words) >> 1) & 0xfffffffc) - 3;
        }
        local_c8.words = AVar25.words;
        local_b0 = (WirePointer *)CONCAT44(local_b0._4_4_,(ListElementCount)local_b0 + uVar21);
        *(int *)((long)&(local_c8.words)->content + 4) = (int)uVar5 * 8 + 7;
        pwVar10 = pwVar11 + 1;
        *(int *)&pwVar11->content = (int)local_88 * 4;
        *(short *)((long)&pwVar11->content + 4) = (short)local_98;
        *(ushort *)((long)&pwVar11->content + 6) = uVar3;
        iVar4 = (int)local_a0;
        local_80 = pwVar10;
        if (bVar20 == 6) {
          pWVar14 = (WirePointer *)(pwVar10 + local_78);
          uVar7 = (ulong)local_88 & 0xffffffff;
          pWVar13 = local_a8;
          while( true ) {
            local_c8.segment = AVar25.segment;
            iVar16 = (int)uVar7;
            uVar7 = (ulong)(iVar16 - 1);
            if (iVar16 == 0) break;
            WireHelpers::transferPointer(local_c8.segment,pWVar14,this_00,pWVar13);
            local_c8 = AVar25;
            pWVar13 = pWVar13 + 1;
            pWVar14 = (WirePointer *)
                      ((long)&(pWVar14->offsetAndKind).value + (ulong)(uint)(iVar4 * 8));
            AVar25 = local_c8;
          }
        }
        else {
          uVar9 = (ulong)(uVar21 >> 3);
          uVar7 = (ulong)local_88 & 0xffffffff;
          pWVar14 = local_a8;
          while (iVar16 = (int)uVar7, uVar7 = (ulong)(iVar16 - 1), iVar16 != 0) {
            if (0xfffffffffffffffb < (ulong)bVar20 - 6) {
              local_c8 = AVar25;
              memcpy(pwVar10,pWVar14,uVar9);
              AVar25 = local_c8;
            }
            pWVar14 = (WirePointer *)((long)&(pWVar14->offsetAndKind).value + uVar9);
            pwVar10 = (word *)((long)&pwVar10->content + (ulong)(uint)(iVar4 * 8));
          }
        }
        pWVar14 = local_88;
        local_c8 = AVar25;
        uVar5 = assertMax<536870910u,unsigned_long,capnp::_::WireHelpers::getWritableStructListPointer(capnp::_::WirePointer*,capnp::word*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::StructSize,capnp::word_const*,capnp::_::BuilderArena*)::_lambda()_4_>
                          (((ulong)local_b0 & 0xffffffff) * (long)local_88 + 0x3f >> 6,
                           (anon_class_1_0_00000001 *)&local_b8);
        if ((int)uVar5 != 0) {
          memset(local_a8,0,(ulong)(uint)((int)uVar5 << 3));
        }
        local_70->segment = local_c8.segment;
        local_70->capTable = local_90;
        local_70->ptr = (byte *)local_80;
        local_70->elementCount = (ListElementCount)pWVar14;
        local_70->step = (int)local_a0 << 6;
        local_70->structDataSize = (int)local_78 << 6;
        __return_storage_ptr__ = local_70;
LAB_00236598:
        __return_storage_ptr__->structPointerCount = uVar3;
        local_70 = __return_storage_ptr__;
        goto LAB_0023659d;
      }
      local_70 = __return_storage_ptr__;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                (&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x603,FAILED,"oldSize != ElementSize::BIT",
                 "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                 ,(char (*) [106])
                  "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                );
      kj::_::Debug::Fault::~Fault(&local_b8);
      __return_storage_ptr__ = local_70;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[68]>
                (&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x5a3,FAILED,"oldRef->kind() == WirePointer::LIST",
                 "\"Called getList{Field,Element}() but existing pointer is not a list.\"",
                 (char (*) [68])
                 "Called getList{Field,Element}() but existing pointer is not a list.");
LAB_00236638:
      kj::_::Debug::Fault::~Fault(&local_b8);
    }
LAB_00235cea:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
      local_70 = __return_storage_ptr__;
LAB_0023659d:
      local_70->elementSize = INLINE_COMPOSITE;
      return local_70;
    }
    local_a0 = uVar7;
    local_a8 = (WirePointer *)
               WireHelpers::copyMessage
                         (&local_c8.segment,local_90,(WirePointer **)&local_c8.words,
                          (WirePointer *)defaultValue);
    uVar21 = ((WireValue<uint32_t> *)&(local_c8.words)->content)->value;
    defaultValue = (word *)0x0;
    uVar7 = local_a0;
  } while( true );
}

Assistant:

ListBuilder PointerBuilder::getStructList(StructSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableStructListPointer(
      pointer, segment, capTable, elementSize, defaultValue);
}